

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainReal.c
# Opt level: O1

int TypeCheck(Abc_Frame_t *pAbc,char *s)

{
  int iVar1;
  int iVar2;
  
  iVar1 = strcmp(s,"blif");
  iVar2 = 1;
  if (iVar1 != 0) {
    iVar1 = strcmp(s,"bench");
    if (iVar1 != 0) {
      iVar1 = strcmp(s,"pla");
      if (iVar1 != 0) {
        iVar1 = strcmp(s,"none");
        if (iVar1 != 0) {
          iVar2 = 0;
          fprintf((FILE *)pAbc->Err,"unknown type %s\n",s);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int TypeCheck( Abc_Frame_t * pAbc, const char * s )
{
    if (strcmp(s, "blif") == 0)
        return 1;
    else if (strcmp(s, "bench") == 0)
        return 1;
    else if (strcmp(s, "pla") == 0)
        return 1;
    else if (strcmp(s, "none") == 0)
        return 1;
    else {
        fprintf( pAbc->Err, "unknown type %s\n", s );
        return 0;
    }
}